

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_lcp_2way_unstable<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  lcp_t *lcp_output_00;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  MergeResult MVar6;
  MergeResult MVar7;
  uchar **ppuVar8;
  ulong uVar9;
  size_t n_00;
  ulong uVar10;
  lcp_t *plVar11;
  lcp_t *lcp_input0;
  uchar **ppuVar12;
  uchar **from0;
  byte bVar13;
  lcp_t lVar14;
  lcp_t in_R9;
  long lVar15;
  
  if (n < 0x20) {
    if (1 < (long)n) {
      uVar10 = n & 0xffffffff;
      ppuVar8 = strings_input;
      do {
        iVar4 = (int)uVar10;
        uVar10 = (ulong)(iVar4 - 1);
        pbVar2 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar12 = ppuVar8; strings_input < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          pbVar3 = ppuVar12[-1];
          bVar13 = *pbVar3;
          in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar2);
          if (bVar13 != 0 && bVar13 == *pbVar2) {
            lVar15 = 1;
            do {
              bVar13 = pbVar3[lVar15];
              pbVar1 = pbVar2 + lVar15;
              in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar1);
              if (bVar13 == 0) break;
              lVar15 = lVar15 + 1;
            } while (bVar13 == *pbVar1);
          }
          if (bVar13 <= (byte)in_R9) break;
          *ppuVar12 = pbVar3;
        }
        *ppuVar12 = pbVar2;
      } while (2 < iVar4);
    }
    if (n != 1) {
      uVar10 = 0;
      do {
        uVar9 = (ulong)((int)uVar10 + 1);
        lVar15 = 0;
        lVar14 = 0;
        do {
          if ((strings_input[uVar10][lVar15] == '\0') ||
             (strings_input[uVar10][lVar15] != strings_input[uVar9][lVar15])) {
            bVar5 = false;
            in_R9 = lVar14;
          }
          else {
            lVar14 = lVar14 + 1;
            bVar5 = true;
          }
          lVar15 = lVar15 + 1;
        } while (bVar5);
        lcp_input[uVar10] = in_R9;
        uVar10 = uVar9;
      } while (uVar9 < n - 1);
    }
  }
  else {
    uVar10 = n >> 1;
    MVar6 = mergesort_lcp_2way_unstable<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar10);
    plVar11 = lcp_input;
    ppuVar8 = strings_input;
    if (MVar6 != SortedInPlace) {
      plVar11 = lcp_output;
      ppuVar8 = strings_output;
    }
    check_input(ppuVar8,plVar11,uVar10);
    ppuVar8 = strings_input + uVar10;
    ppuVar12 = strings_output + uVar10;
    plVar11 = lcp_input + uVar10;
    lcp_output_00 = lcp_output + uVar10;
    n_00 = n - uVar10;
    MVar7 = mergesort_lcp_2way_unstable<true>(ppuVar8,ppuVar12,plVar11,lcp_output_00,n_00);
    lcp_input0 = plVar11;
    from0 = ppuVar8;
    if (MVar7 != SortedInPlace) {
      lcp_input0 = lcp_output_00;
      from0 = ppuVar12;
    }
    check_input(from0,lcp_input0,n_00);
    if (MVar6 != MVar7) {
      if (MVar6 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x6b7,
                      "MergeResult mergesort_lcp_2way_unstable(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      memcpy(ppuVar8,ppuVar12,n_00 * 8);
      memcpy(plVar11,lcp_output_00,n_00 * 8);
    }
    if (MVar6 == SortedInPlace) {
      merge_lcp_2way_unstable<true>
                (strings_input,lcp_input,uVar10,ppuVar8,plVar11,n_00,strings_output,lcp_output);
      return SortedInTemp;
    }
    merge_lcp_2way_unstable<true>
              (strings_output,lcp_output,uVar10,ppuVar12,lcp_output_00,n_00,strings_input,lcp_input)
    ;
  }
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml = mergesort_lcp_2way_unstable<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);

	debug() << __func__ << "(): checking first merge\n";
	if (ml == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);

	MergeResult mr = mergesort_lcp_2way_unstable<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);

	debug() << __func__ << "(): checking second merge\n";
	if (mr == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  n-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, n-split0);

	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}